

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdCombinePsbt(void *handle,void *psbt_handle,char *psbt_combine_base64)

{
  Transaction *pTVar1;
  bool bVar2;
  CfdException *pCVar3;
  Psbt combine_psbt;
  allocator local_d1;
  Psbt local_d0;
  string local_50;
  
  cfd::Initialize();
  pTVar1 = &local_d0.super_Psbt.base_tx_;
  local_d0.super_Psbt._vptr_Psbt = (_func_int **)pTVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_d0);
  if ((Transaction *)local_d0.super_Psbt._vptr_Psbt != pTVar1) {
    operator_delete(local_d0.super_Psbt._vptr_Psbt);
  }
  bVar2 = cfd::capi::IsEmptyString(psbt_combine_base64);
  if (!bVar2) {
    if (*(long *)((long)psbt_handle + 0x18) != 0) {
      std::__cxx11::string::string((string *)&local_50,psbt_combine_base64,&local_d1);
      cfd::Psbt::Psbt(&local_d0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      cfd::core::Psbt::Combine(*(Psbt **)((long)psbt_handle + 0x18),&local_d0.super_Psbt);
      local_d0.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
      std::
      _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
      ::~_Rb_tree(&local_d0.verify_ignore_map_._M_t);
      cfd::core::Psbt::~Psbt(&local_d0.super_Psbt);
      return 0;
    }
    local_d0.super_Psbt._vptr_Psbt = (_func_int **)0x5f5c0a;
    local_d0.super_Psbt.wally_psbt_pointer_._0_4_ = 0x1f2;
    local_d0.super_Psbt.base_tx_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f5cf7;
    cfd::core::logger::log<>((CfdSourceLocation *)&local_d0,kCfdLogLevelWarning,"psbt is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0.super_Psbt._vptr_Psbt = (_func_int **)pTVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_d0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d0.super_Psbt._vptr_Psbt = (_func_int **)0x5f5c0a;
  local_d0.super_Psbt.wally_psbt_pointer_._0_4_ = 0x1ec;
  local_d0.super_Psbt.base_tx_.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5f5cf7;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_d0,kCfdLogLevelWarning,
             "psbt_combine_base64 is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_d0.super_Psbt._vptr_Psbt = (_func_int **)pTVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Failed to parameter. psbt_combine_base64 is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_d0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCombinePsbt(
    void* handle, void* psbt_handle, const char* psbt_combine_base64) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(psbt_combine_base64)) {
      warn(CFD_LOG_SOURCE, "psbt_combine_base64 is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. psbt_combine_base64 is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Psbt combine_psbt(psbt_combine_base64);
    psbt_obj->psbt->Combine(combine_psbt);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}